

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClearDragDrop(void)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  GImGui->DragDropActive = false;
  ImGuiPayload::Clear((ImGuiPayload *)g);
  pIVar1->DragDropAcceptFlags = 0;
  pIVar1->DragDropAcceptIdPrev = 0;
  pIVar1->DragDropAcceptIdCurr = 0;
  pIVar1->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar1->DragDropAcceptFrameCount = -1;
  ImVector<unsigned_char>::clear((ImVector<unsigned_char> *)g);
  memset(pIVar1->DragDropPayloadBufLocal,0,8);
  return;
}

Assistant:

void ImGui::ClearDragDrop()
{
    ImGuiContext& g = *GImGui;
    g.DragDropActive = false;
    g.DragDropPayload.Clear();
    g.DragDropAcceptFlags = ImGuiDragDropFlags_None;
    g.DragDropAcceptIdCurr = g.DragDropAcceptIdPrev = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropAcceptFrameCount = -1;

    g.DragDropPayloadBufHeap.clear();
    memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
}